

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_distefano_1999.h
# Opt level: O0

void __thiscall DiStefano::PerformLabeling(DiStefano *this)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  uchar *puVar9;
  uint *puVar10;
  int local_104;
  int iLabel;
  int x_1;
  uint *img_labels_row_1;
  int local_f0;
  int y_1;
  int k_3;
  int k_2;
  int k_1;
  int i_class_1;
  int k;
  int i_class;
  int lx;
  int ls;
  int lr;
  int lq;
  int lp;
  int x;
  uint *img_labels_row_prev;
  uint *img_labels_row;
  uchar *img_row;
  int y;
  int *a_renum;
  bool *a_single;
  int *a_class;
  int i_new_label;
  Size local_78;
  Mat_<int> local_70;
  DiStefano *local_10;
  DiStefano *this_local;
  
  local_10 = this;
  cv::MatSize::operator()((MatSize *)&local_78);
  cv::Mat_<int>::Mat_(&local_70,&local_78);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_70)
  ;
  cv::Mat_<int>::~Mat_(&local_70);
  a_class._0_4_ = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                  field_0x8 + 1) / 2) *
                 (long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                  field_0xc + 1) / 2) + 1;
  uVar5 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  pvVar7 = operator_new__((long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)
                                           ->field_0x8 + 1) / 2) *
                          (long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)
                                           ->field_0xc + 1) / 2) + 1);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                  field_0x8 + 1) / 2) *
                 (long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                  field_0xc + 1) / 2) + 1;
  uVar5 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar5);
  for (img_row._4_4_ = 0;
      img_row._4_4_ < *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
      img_row._4_4_ = img_row._4_4_ + 1) {
    puVar9 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        img_row._4_4_);
    puVar10 = cv::Mat::ptr<unsigned_int>
                        (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,img_row._4_4_);
    lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    for (lq = 0; lq < *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
        lq = lq + 1) {
      if (puVar9[lq] == '\0') {
        puVar10[lq] = 0;
      }
      else {
        lr = 0;
        ls = 0;
        lx = 0;
        i_class = 0;
        if (0 < img_row._4_4_) {
          if (0 < lq) {
            lr = *(int *)((long)puVar10 + ((long)(lq + -1) * 4 - lVar2));
          }
          ls = *(int *)((long)puVar10 + ((long)lq * 4 - lVar2));
          if (lq < *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc +
                   -1) {
            lx = *(int *)((long)puVar10 + ((long)(lq + 1) * 4 - lVar2));
          }
        }
        if (0 < lq) {
          i_class = puVar10[lq + -1];
        }
        if ((((lr == 0) && (ls == 0)) && (lx == 0)) && (i_class == 0)) {
          k = (int)a_class + 1;
          *(int *)((long)pvVar6 + (long)k * 4) = k;
          *(undefined1 *)((long)pvVar7 + (long)k) = 1;
          a_class._0_4_ = k;
        }
        else {
          k = lr;
          if (lr == 0) {
            k = ls;
          }
          if (k < 1) {
            k = lx;
          }
          else if ((0 < lx) &&
                  (*(int *)((long)pvVar6 + (long)k * 4) != *(int *)((long)pvVar6 + (long)lx * 4))) {
            if ((*(byte *)((long)pvVar7 + (long)*(int *)((long)pvVar6 + (long)k * 4)) & 1) == 0) {
              if ((*(byte *)((long)pvVar7 + (long)*(int *)((long)pvVar6 + (long)lx * 4)) & 1) == 0)
              {
                iVar1 = *(int *)((long)pvVar6 + (long)lx * 4);
                for (k_1 = 1; k_1 <= (int)a_class; k_1 = k_1 + 1) {
                  if (*(int *)((long)pvVar6 + (long)k_1 * 4) == iVar1) {
                    *(undefined4 *)((long)pvVar6 + (long)k_1 * 4) =
                         *(undefined4 *)((long)pvVar6 + (long)k * 4);
                  }
                }
              }
              else {
                *(undefined4 *)((long)pvVar6 + (long)lx * 4) =
                     *(undefined4 *)((long)pvVar6 + (long)k * 4);
                *(undefined1 *)((long)pvVar7 + (long)*(int *)((long)pvVar6 + (long)k * 4)) = 0;
              }
            }
            else {
              *(undefined4 *)((long)pvVar6 + (long)k * 4) =
                   *(undefined4 *)((long)pvVar6 + (long)lx * 4);
              *(undefined1 *)((long)pvVar7 + (long)*(int *)((long)pvVar6 + (long)lx * 4)) = 0;
            }
          }
          if (k < 1) {
            k = i_class;
          }
          else if ((0 < i_class) &&
                  (*(int *)((long)pvVar6 + (long)k * 4) !=
                   *(int *)((long)pvVar6 + (long)i_class * 4))) {
            if ((*(byte *)((long)pvVar7 + (long)*(int *)((long)pvVar6 + (long)k * 4)) & 1) == 0) {
              if ((*(byte *)((long)pvVar7 + (long)*(int *)((long)pvVar6 + (long)i_class * 4)) & 1)
                  == 0) {
                iVar1 = *(int *)((long)pvVar6 + (long)i_class * 4);
                for (k_3 = 1; k_3 <= (int)a_class; k_3 = k_3 + 1) {
                  if (*(int *)((long)pvVar6 + (long)k_3 * 4) == iVar1) {
                    *(undefined4 *)((long)pvVar6 + (long)k_3 * 4) =
                         *(undefined4 *)((long)pvVar6 + (long)k * 4);
                  }
                }
              }
              else {
                *(undefined4 *)((long)pvVar6 + (long)i_class * 4) =
                     *(undefined4 *)((long)pvVar6 + (long)k * 4);
                *(undefined1 *)((long)pvVar7 + (long)*(int *)((long)pvVar6 + (long)k * 4)) = 0;
              }
            }
            else {
              *(undefined4 *)((long)pvVar6 + (long)k * 4) =
                   *(undefined4 *)((long)pvVar6 + (long)i_class * 4);
              *(undefined1 *)((long)pvVar7 + (long)*(int *)((long)pvVar6 + (long)i_class * 4)) = 0;
            }
          }
        }
        puVar10[lq] = k;
      }
    }
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 0;
  for (y_1 = 1; y_1 <= (int)a_class; y_1 = y_1 + 1) {
    if (*(int *)((long)pvVar6 + (long)y_1 * 4) == y_1) {
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ =
           (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ + 1;
      *(uint *)((long)pvVar8 + (long)y_1 * 4) =
           (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_;
    }
  }
  for (local_f0 = 1; local_f0 <= (int)a_class; local_f0 = local_f0 + 1) {
    *(undefined4 *)((long)pvVar6 + (long)local_f0 * 4) =
         *(undefined4 *)((long)pvVar8 + (long)*(int *)((long)pvVar6 + (long)local_f0 * 4) * 4);
  }
  for (img_labels_row_1._4_4_ = 0;
      img_labels_row_1._4_4_ <
      *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8;
      img_labels_row_1._4_4_ = img_labels_row_1._4_4_ + 1) {
    puVar10 = cv::Mat::ptr<unsigned_int>
                        (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,img_labels_row_1._4_4_);
    for (local_104 = 0;
        local_104 <
        *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0xc;
        local_104 = local_104 + 1) {
      if (0 < (int)puVar10[local_104]) {
        puVar10[local_104] = *(uint *)((long)pvVar6 + (long)(int)puVar10[local_104] * 4);
      }
    }
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ + 1;
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  if (pvVar7 != (void *)0x0) {
    operator_delete__(pvVar7);
  }
  if (pvVar8 != (void *)0x0) {
    operator_delete__(pvVar8);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size());

        int i_new_label(0);

        // p q r		  p
        // s x			q x
        // lp,lq,lx: labels assigned to p,q,x

        // First scan
        int *a_class = new int[UPPER_BOUND_8_CONNECTIVITY];
        bool *a_single = new bool[UPPER_BOUND_8_CONNECTIVITY];
        int *a_renum = new int[UPPER_BOUND_8_CONNECTIVITY];

        for (int y = 0; y < img_.rows; y++) {

            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int x = 0; x < img_.cols; x++) {
                if (img_row[x]) {

                    int lp(0), lq(0), lr(0), ls(0), lx(0); // lMin(INT_MAX);
                    if (y > 0) {
                        if (x > 0)
                            lp = img_labels_row_prev[x - 1];
                        lq = img_labels_row_prev[x];
                        if (x < img_.cols - 1)
                            lr = img_labels_row_prev[x + 1];
                    }
                    if (x > 0)
                        ls = img_labels_row[x - 1];

                    // If everything around is background
                    if (lp == 0 && lq == 0 && lr == 0 && ls == 0) {
                        lx = ++i_new_label;
                        a_class[lx] = lx;
                        a_single[lx] = true;
                    }
                    else {
                        // p
                        lx = lp;
                        // q
                        if (lx == 0)
                            lx = lq;
                        // r
                        if (lx > 0) {
                            if (lr > 0 && a_class[lx] != a_class[lr]) {
                                if (a_single[a_class[lx]]) {
                                    a_class[lx] = a_class[lr];
                                    a_single[a_class[lr]] = false;
                                }
                                else if (a_single[a_class[lr]]) {
                                    a_class[lr] = a_class[lx];
                                    a_single[a_class[lx]] = false;
                                }
                                else {
                                    int i_class = a_class[lr];
                                    for (int k = 1; k <= i_new_label; k++) {
                                        if (a_class[k] == i_class) {
                                            a_class[k] = a_class[lx];
                                        }
                                    }
                                }
                            }
                        }
                        else
                            lx = lr;
                        // s
                        if (lx > 0) {
                            if (ls > 0 && a_class[lx] != a_class[ls]) {
                                if (a_single[a_class[lx]]) {
                                    a_class[lx] = a_class[ls];
                                    a_single[a_class[ls]] = false;
                                }
                                else if (a_single[a_class[ls]]) {
                                    a_class[ls] = a_class[lx];
                                    a_single[a_class[lx]] = false;
                                }
                                else {
                                    int i_class = a_class[ls];
                                    for (int k = 1; k <= i_new_label; k++) {
                                        if (a_class[k] == i_class) {
                                            a_class[k] = a_class[lx];
                                        }
                                    }
                                }
                            }
                        }
                        else
                            lx = ls;
                    }

                    img_labels_row[x] = lx;
                }
                else
                    img_labels_row[x] = 0;
            }
        }

        // Renumbering of labels
        n_labels_ = 0;
        for (int k = 1; k <= i_new_label; k++) {
            if (a_class[k] == k) {
                n_labels_++;
                a_renum[k] = n_labels_;
            }
        }
        for (int k = 1; k <= i_new_label; k++)
            a_class[k] = a_renum[a_class[k]];

        // Second scan
        for (int y = 0; y < img_labels_.rows; y++) {

            // Get rows pointer
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);

            for (int x = 0; x < img_labels_.cols; x++) {
                int iLabel = img_labels_row[x];
                if (iLabel > 0)
                    img_labels_row[x] = a_class[iLabel];
            }
        }

        n_labels_++; // To count also background

        delete[] a_class;
        delete[] a_single;
        delete[] a_renum;
    }